

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O1

void __thiscall google::LogMessage::~LogMessage(LogMessage *this)

{
  LogMessageData *pLVar1;
  undefined1 *puVar2;
  
  Flush(this);
  pLVar1 = this->data_;
  puVar2 = (undefined1 *)__tls_get_addr(&PTR_00138cc0);
  if (pLVar1 == (LogMessageData *)(puVar2 + 8)) {
    (pLVar1->stream_).super_ostream._vptr_basic_ostream = (_func_int **)&PTR__LogStream_001381b8;
    *(undefined ***)&(pLVar1->stream_).super_ostream.field_0x58 = &PTR__LogStream_001381e0;
    *(code **)&(pLVar1->stream_).super_ostream.field_0x8 = __assert_fail;
    std::locale::~locale((locale *)&(pLVar1->stream_).super_ostream.field_0x40);
    std::ios_base::~ios_base((ios_base *)&(pLVar1->stream_).super_ostream.field_0x58);
    *puVar2 = 1;
  }
  else {
    pLVar1 = this->allocated_;
    if (pLVar1 != (LogMessageData *)0x0) {
      (pLVar1->stream_).super_ostream._vptr_basic_ostream = (_func_int **)&PTR__LogStream_001381b8;
      *(undefined ***)&(pLVar1->stream_).super_ostream.field_0x58 = &PTR__LogStream_001381e0;
      *(code **)&(pLVar1->stream_).super_ostream.field_0x8 = __assert_fail;
      std::locale::~locale((locale *)&(pLVar1->stream_).super_ostream.field_0x40);
      std::ios_base::~ios_base((ios_base *)&(pLVar1->stream_).super_ostream.field_0x58);
      operator_delete(pLVar1,0x76e8);
      return;
    }
  }
  return;
}

Assistant:

LogMessage::~LogMessage() {
  Flush();
#ifdef GLOG_THREAD_LOCAL_STORAGE
  if (data_ == static_cast<void*>(&thread_msg_data)) {
    data_->~LogMessageData();
    thread_data_available = true;
  } else {
    delete allocated_;
  }
#else   // !defined(GLOG_THREAD_LOCAL_STORAGE)
  delete allocated_;
#endif  // defined(GLOG_THREAD_LOCAL_STORAGE)
}